

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

bool is_placeholder_or_list(Am_Value *v)

{
  bool bVar1;
  bool bVar2;
  Am_Value *in_value;
  Am_Value_List l;
  Am_Value subv;
  Am_Value_List AStack_68;
  Am_Value local_58;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  bVar1 = Am_Value::Valid(v);
  if (bVar1) {
    if (v->type == 0xa001) {
      Am_Object::Am_Object((Am_Object *)&AStack_68,v);
      Am_Object::Am_Object(&local_48,&Am_A_Placeholder);
      bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&AStack_68,&local_48);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object((Am_Object *)&AStack_68);
      if (bVar1) {
        return true;
      }
    }
    else {
      bVar1 = Am_Value_List::Test(v);
      if (bVar1) {
        Am_Value_List::Am_Value_List(&AStack_68,v);
        local_58.type = 0;
        local_58.value.wrapper_value = (Am_Wrapper *)0x0;
        Am_Value_List::Start(&AStack_68);
        while (bVar1 = Am_Value_List::Last(&AStack_68), !bVar1) {
          in_value = Am_Value_List::Get(&AStack_68);
          Am_Value::operator=(&local_58,in_value);
          if (local_58.type == 0xa001) {
            Am_Object::Am_Object(&local_38,&local_58);
            Am_Object::Am_Object(&local_40,&Am_A_Placeholder);
            bVar2 = Am_Object::Is_Instance_Of(&local_38,&local_40);
            Am_Object::~Am_Object(&local_40);
            Am_Object::~Am_Object(&local_38);
          }
          else {
            bVar2 = false;
          }
          if (bVar2 != false) {
            Am_Value::~Am_Value(&local_58);
            Am_Value_List::~Am_Value_List(&AStack_68);
            if (bVar1) {
              return false;
            }
            return true;
          }
          Am_Value_List::Next(&AStack_68);
        }
        Am_Value::~Am_Value(&local_58);
        Am_Value_List::~Am_Value_List(&AStack_68);
      }
    }
  }
  return false;
}

Assistant:

bool
is_placeholder_or_list(Am_Value &v)
{
  if (v.Valid()) {
    if (v.type == Am_OBJECT) {
      if (Am_Object(v).Is_Instance_Of(Am_A_Placeholder))
        return true;
    } else if (Am_Value_List::Test(v)) {
      Am_Value_List l = v;
      Am_Value subv;
      for (l.Start(); !l.Last(); l.Next()) {
        subv = l.Get();
        if (subv.type == Am_OBJECT &&
            Am_Object(subv).Is_Instance_Of(Am_A_Placeholder))
          return true;
      }
    }
  }
  return false;
}